

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# publication.cpp
# Opt level: O3

void __thiscall miniros::Publication::dropAllConnections(Publication *this)

{
  pointer psVar1;
  int iVar2;
  iterator i;
  pointer psVar3;
  V_SubscriberLink local_publishers;
  vector<std::shared_ptr<miniros::SubscriberLink>,_std::allocator<std::shared_ptr<miniros::SubscriberLink>_>_>
  local_38;
  
  local_38.
  super__Vector_base<std::shared_ptr<miniros::SubscriberLink>,_std::allocator<std::shared_ptr<miniros::SubscriberLink>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.
  super__Vector_base<std::shared_ptr<miniros::SubscriberLink>,_std::allocator<std::shared_ptr<miniros::SubscriberLink>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.
  super__Vector_base<std::shared_ptr<miniros::SubscriberLink>,_std::allocator<std::shared_ptr<miniros::SubscriberLink>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->subscriber_links_mutex_);
  if (iVar2 == 0) {
    psVar3 = (this->subscriber_links_).
             super__Vector_base<std::shared_ptr<miniros::SubscriberLink>,_std::allocator<std::shared_ptr<miniros::SubscriberLink>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar1 = (this->subscriber_links_).
             super__Vector_base<std::shared_ptr<miniros::SubscriberLink>,_std::allocator<std::shared_ptr<miniros::SubscriberLink>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_38.
    super__Vector_base<std::shared_ptr<miniros::SubscriberLink>,_std::allocator<std::shared_ptr<miniros::SubscriberLink>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (this->subscriber_links_).
         super__Vector_base<std::shared_ptr<miniros::SubscriberLink>,_std::allocator<std::shared_ptr<miniros::SubscriberLink>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->subscriber_links_).
    super__Vector_base<std::shared_ptr<miniros::SubscriberLink>,_std::allocator<std::shared_ptr<miniros::SubscriberLink>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (this->subscriber_links_).
    super__Vector_base<std::shared_ptr<miniros::SubscriberLink>,_std::allocator<std::shared_ptr<miniros::SubscriberLink>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (this->subscriber_links_).
    super__Vector_base<std::shared_ptr<miniros::SubscriberLink>,_std::allocator<std::shared_ptr<miniros::SubscriberLink>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_38.
    super__Vector_base<std::shared_ptr<miniros::SubscriberLink>,_std::allocator<std::shared_ptr<miniros::SubscriberLink>_>_>
    ._M_impl.super__Vector_impl_data._M_start = psVar3;
    local_38.
    super__Vector_base<std::shared_ptr<miniros::SubscriberLink>,_std::allocator<std::shared_ptr<miniros::SubscriberLink>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = psVar1;
    pthread_mutex_unlock((pthread_mutex_t *)&this->subscriber_links_mutex_);
    if (psVar3 != psVar1) {
      do {
        (*((psVar3->super___shared_ptr<miniros::SubscriberLink,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
          ->_vptr_SubscriberLink[3])();
        psVar3 = psVar3 + 1;
      } while (psVar3 != local_38.
                         super__Vector_base<std::shared_ptr<miniros::SubscriberLink>,_std::allocator<std::shared_ptr<miniros::SubscriberLink>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    std::
    vector<std::shared_ptr<miniros::SubscriberLink>,_std::allocator<std::shared_ptr<miniros::SubscriberLink>_>_>
    ::~vector(&local_38);
    return;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

void Publication::dropAllConnections()
{
  // Swap our publishers list with a local one so we can only lock for a short period of time, because a
  // side effect of our calling drop() on connections can be re-locking the publishers mutex
  V_SubscriberLink local_publishers;

  {
    std::scoped_lock<std::mutex> lock(subscriber_links_mutex_);

    local_publishers.swap(subscriber_links_);
  }

  for (V_SubscriberLink::iterator i = local_publishers.begin();
           i != local_publishers.end(); ++i)
  {
    (*i)->drop();
  }
}